

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::appendTetra(btSoftBody *this,int node0,int node1,int node2,int node3,Material *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Node *pNVar4;
  Tetra *pTVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  appendTetra(this,-1,mat);
  lVar9 = (long)(this->m_tetras).m_size;
  pNVar4 = (this->m_nodes).m_data;
  pTVar5 = (this->m_tetras).m_data;
  pTVar5[lVar9 + -1].m_n[0] = pNVar4 + node0;
  pNVar6 = (this->m_nodes).m_data;
  pTVar5[lVar9 + -1].m_n[1] = pNVar6 + node1;
  pNVar7 = (this->m_nodes).m_data;
  pTVar5[lVar9 + -1].m_n[2] = pNVar7 + node2;
  pNVar8 = (this->m_nodes).m_data;
  pTVar5[lVar9 + -1].m_n[3] = pNVar8 + node3;
  fVar1 = pNVar4[node0].m_x.m_floats[0];
  fVar2 = pNVar4[node0].m_x.m_floats[1];
  fVar3 = pNVar4[node0].m_x.m_floats[2];
  fVar10 = pNVar7[node2].m_x.m_floats[0] - fVar1;
  fVar14 = pNVar7[node2].m_x.m_floats[1] - fVar2;
  fVar11 = pNVar7[node2].m_x.m_floats[2] - fVar3;
  fVar13 = pNVar8[node3].m_x.m_floats[0] - fVar1;
  fVar12 = pNVar8[node3].m_x.m_floats[1] - fVar2;
  fVar15 = pNVar8[node3].m_x.m_floats[2] - fVar3;
  pTVar5[lVar9 + -1].m_rv =
       (fVar12 * fVar10 - fVar13 * fVar14) * (pNVar6[node1].m_x.m_floats[2] - fVar3) +
       (fVar11 * fVar13 - fVar15 * fVar10) * (pNVar6[node1].m_x.m_floats[1] - fVar2) +
       (fVar14 * fVar15 - fVar12 * fVar11) * (pNVar6[node1].m_x.m_floats[0] - fVar1);
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::appendTetra(int node0,
										int node1,
										int node2,
										int node3,
										Material* mat)
{
	appendTetra(-1,mat);
	Tetra&	t=m_tetras[m_tetras.size()-1];
	t.m_n[0]	=	&m_nodes[node0];
	t.m_n[1]	=	&m_nodes[node1];
	t.m_n[2]	=	&m_nodes[node2];
	t.m_n[3]	=	&m_nodes[node3];
	t.m_rv		=	VolumeOf(t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x);
	m_bUpdateRtCst=true;
}